

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void __thiscall
helics::CloningFilter::CloningFilter(CloningFilter *this,Core *core,string_view filtName)

{
  Core *pCVar1;
  int iVar2;
  undefined8 in_R9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<helics::FilterOperations> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Filter::Filter(&this->super_Filter,core,filtName,(InterfaceHandle)0x9aac0f00);
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Filter_004476f0;
  pCVar1 = (this->super_Filter).super_Interface.mCore;
  local_38 = 0;
  uStack_30 = 0;
  iVar2 = (*pCVar1->_vptr_Core[0x3a])(pCVar1,filtName._M_len,filtName._M_str,0,0,in_R9,0,0);
  (this->super_Filter).super_Interface.handle.hid = iVar2;
  std::make_shared<helics::CloneFilterOperation>();
  local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_pi;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Filter::setFilterOperations(&this->super_Filter,&local_48);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  return;
}

Assistant:

CloningFilter::CloningFilter(Core* core, std::string_view filtName):
    Filter(core, filtName, InterfaceHandle())
{
    handle = mCore->registerCloningFilter(filtName, std::string_view(), std::string_view());
    setFilterOperations(std::make_shared<CloneFilterOperation>());
}